

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O2

size_type __thiscall
phmap::priv::
raw_hash_set<phmap::priv::FlatHashSetPolicy<cs::token_base*>,phmap::priv::HashEq<cs::token_base*,void>::Hash,phmap::priv::HashEq<cs::token_base*,void>::Eq,std::allocator<cs::token_base*>>
::erase<cs::token_base*>
          (raw_hash_set<phmap::priv::FlatHashSetPolicy<cs::token_base*>,phmap::priv::HashEq<cs::token_base*,void>::Hash,phmap::priv::HashEq<cs::token_base*,void>::Eq,std::allocator<cs::token_base*>>
           *this,key_arg<cs::token_base_*> *key)

{
  bool bVar1;
  iterator it;
  
  it = find<cs::token_base*>
                 ((raw_hash_set<phmap::priv::FlatHashSetPolicy<cs::token_base_*>,_phmap::priv::HashEq<cs::token_base_*,_void>::Hash,_phmap::priv::HashEq<cs::token_base_*,_void>::Eq,_std::allocator<cs::token_base_*>_>
                   *)this,key);
  bVar1 = it.ctrl_ != (ctrl_t *)(*(long *)this + *(long *)(this + 0x18));
  if (bVar1) {
    raw_hash_set<phmap::priv::FlatHashSetPolicy<cs::token_base_*>,_phmap::priv::HashEq<cs::token_base_*,_void>::Hash,_phmap::priv::HashEq<cs::token_base_*,_void>::Eq,_std::allocator<cs::token_base_*>_>
    ::_erase((raw_hash_set<phmap::priv::FlatHashSetPolicy<cs::token_base_*>,_phmap::priv::HashEq<cs::token_base_*,_void>::Hash,_phmap::priv::HashEq<cs::token_base_*,_void>::Eq,_std::allocator<cs::token_base_*>_>
              *)this,it);
  }
  return (ulong)bVar1;
}

Assistant:

size_type erase(const key_arg<K>& key)
			{
				auto it = find(key);
				if (it == end()) return 0;
				_erase(it);
				return 1;
			}